

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  ulong uVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  int *piVar9;
  wchar_t *pwVar10;
  wchar_t wVar11;
  ulong uVar12;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_a4;
  undefined8 local_a0;
  wchar_t *local_98;
  wchar_t local_8c;
  wchar_t *local_88 [6];
  int *local_58;
  int *local_50;
  wchar_t *local_40;
  archive_acl *local_38;
  
  if ((text != (wchar_t *)0x0) && (*text != L'\0')) {
    local_38 = acl;
    local_8c = default_type;
    uVar1 = 0;
    do {
      do {
        while ((uVar12 = uVar1, pwVar7 = text, (ulong)(uint)*text < 0x21 &&
               ((0x100000600U >> ((ulong)(uint)*text & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar1 = uVar12;
        }
        while( true ) {
          wVar6 = *pwVar7;
          if (((ulong)(uint)wVar6 < 0x3b) &&
             (pwVar3 = pwVar7, (0x400100000000401U >> ((ulong)(uint)wVar6 & 0x3f) & 1) != 0)) break;
          pwVar7 = pwVar7 + 1;
        }
        do {
          pwVar8 = pwVar3;
          if (0x20 < (ulong)(uint)pwVar8[-1]) break;
          pwVar3 = pwVar8 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar8[-1] & 0x3f) & 1) != 0);
        wVar11 = *pwVar7;
        if (uVar12 < 4) {
          local_88[uVar12 * 2] = text;
          local_88[uVar12 * 2 + 1] = pwVar8;
        }
        text = pwVar7 + (wVar11 != L'\0');
        uVar1 = uVar12 + 1;
      } while (wVar6 == L':');
      if (uVar12 < 3) {
        memset(local_88 + uVar12 * 2 + 2,0,(uVar12 * -0x10 + 0x20 & 0xffffffff0) + 0x10);
      }
      pwVar3 = local_88[1];
      pwVar7 = local_88[0];
      local_98 = local_88[2];
      if (local_88[2] < local_88[3]) {
        wVar6 = L'\0';
        pwVar8 = local_88[2];
        do {
          wVar11 = *pwVar8;
          if ((uint)(wVar11 + L'\xffffffc6') < 0xfffffff6) goto LAB_0023923b;
          wVar5 = L'\x7fffffff';
          if ((wVar6 < L'\x0ccccccd') && ((wVar6 != L'\x0ccccccc' || (wVar11 < L'8')))) {
            wVar5 = wVar11 + wVar6 * 10 + L'\xffffffd0';
          }
          wVar6 = wVar5;
          pwVar8 = pwVar8 + 1;
        } while (pwVar8 < local_88[3]);
      }
      else {
LAB_0023923b:
        wVar6 = L'\xffffffff';
      }
      wVar11 = wVar6;
      if ((2 < uVar12 && wVar6 == L'\xffffffff') && (local_58 < local_50)) {
        wVar5 = L'\0';
        piVar9 = local_58;
        do {
          iVar4 = *piVar9;
          wVar11 = wVar6;
          if (iVar4 - 0x3aU < 0xfffffff6) break;
          wVar11 = L'\x7fffffff';
          if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (iVar4 < 0x38)))) {
            wVar11 = iVar4 + wVar5 * 10 + L'\xffffffd0';
          }
          wVar5 = wVar11;
          piVar9 = piVar9 + 1;
          wVar11 = wVar5;
        } while (piVar9 < local_50);
      }
      pwVar8 = local_88[3];
      wVar6 = local_8c;
      local_a0 = uVar1;
      if (0x1c < (long)local_88[1] - (long)local_88[0]) {
        local_40 = local_88[3];
        iVar4 = wmemcmp(local_88[0],anon_var_dwarf_176008,7);
        pwVar8 = local_40;
        wVar6 = local_8c;
        if (iVar4 == 0) {
          local_88[0] = pwVar7 + 7;
          wVar6 = L'Ȁ';
        }
      }
      if (local_88[0] == pwVar3) {
        return L'\xffffffec';
      }
      if (*local_88[0] == L'u') {
        pwVar7 = local_88[0] + 1;
        pwVar10 = anon_var_dwarf_31840 + 2;
        do {
          if (pwVar3 <= pwVar7) break;
          wVar2 = *pwVar7;
          pwVar7 = pwVar7 + 1;
          wVar5 = *pwVar10;
          pwVar10 = pwVar10 + 1;
        } while (wVar2 == wVar5);
        if (pwVar7 < pwVar3) goto LAB_00239343;
        local_a0 = CONCAT44(local_a0._4_4_,wVar6);
        wVar6 = ismode_w(local_88[4],local_88[5],&local_a4);
        if (wVar6 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_98 < pwVar8) || (wVar11 != L'\xffffffff')) {
          wVar5 = L'✑';
          pwVar7 = local_98;
        }
        else {
          wVar5 = L'✒';
LAB_00239607:
          pwVar8 = (wchar_t *)0x0;
          pwVar7 = (wchar_t *)0x0;
        }
LAB_0023960d:
        wVar6 = (wchar_t)local_a0;
      }
      else {
LAB_00239343:
        if (local_88[0] == pwVar3) {
          return L'\xffffffec';
        }
        if (*local_88[0] == L'g') {
          pwVar7 = local_88[0] + 1;
          pwVar10 = anon_var_dwarf_314b4 + 2;
          do {
            if (pwVar3 <= pwVar7) break;
            wVar2 = *pwVar7;
            pwVar7 = pwVar7 + 1;
            wVar5 = *pwVar10;
            pwVar10 = pwVar10 + 1;
          } while (wVar2 == wVar5);
          if (pwVar3 <= pwVar7) {
            local_a0 = CONCAT44(local_a0._4_4_,wVar6);
            wVar6 = ismode_w(local_88[4],local_88[5],&local_a4);
            if (wVar6 == L'\0') {
              return L'\xffffffec';
            }
            if ((pwVar8 <= local_98) && (wVar11 == L'\xffffffff')) {
              wVar5 = L'✔';
              goto LAB_00239607;
            }
            wVar5 = L'✓';
            pwVar7 = local_98;
            goto LAB_0023960d;
          }
        }
        if (local_88[0] == pwVar3) {
          return L'\xffffffec';
        }
        iVar4 = (int)uVar12;
        if (*local_88[0] == L'o') {
          pwVar7 = local_88[0] + 1;
          piVar9 = anon_var_dwarf_17604d;
          do {
            piVar9 = piVar9 + 1;
            if (pwVar3 <= pwVar7) break;
            wVar5 = *pwVar7;
            pwVar7 = pwVar7 + 1;
          } while (wVar5 == *piVar9);
          if (pwVar7 < pwVar3) goto LAB_002393b3;
          if (iVar4 == 2) {
joined_r0x002395d9:
            if (local_98 != pwVar8) {
              return L'\xffffffec';
            }
            if (local_88[5] <= local_88[4]) {
              return L'\xffffffec';
            }
            local_a0._4_4_ = (undefined4)(local_a0 >> 0x20);
            local_a0 = CONCAT44(local_a0._4_4_,wVar6);
            wVar6 = ismode_w(local_88[4],local_88[5],&local_a4);
            if (wVar6 == L'\0') {
              return L'\xffffffec';
            }
            wVar5 = L'✖';
            goto LAB_00239607;
          }
          if (iVar4 != 1) {
            return L'\xffffffec';
          }
          if ((pwVar8 <= local_98) || (wVar5 = ismode_w(local_98,pwVar8,&local_a4), wVar5 == L'\0'))
          {
            if (local_a0 != 3) {
              return L'\xffffffec';
            }
            local_a0 = 0;
            goto joined_r0x002395d9;
          }
          wVar5 = L'✖';
LAB_00239550:
          pwVar8 = (wchar_t *)0x0;
          pwVar7 = (wchar_t *)0x0;
        }
        else {
LAB_002393b3:
          if (local_88[0] == pwVar3) {
            return L'\xffffffec';
          }
          if (*local_88[0] != L'm') {
            return L'\xffffffec';
          }
          pwVar7 = local_88[0] + 1;
          piVar9 = anon_var_dwarf_176058;
          do {
            piVar9 = piVar9 + 1;
            if (pwVar3 <= pwVar7) break;
            wVar5 = *pwVar7;
            pwVar7 = pwVar7 + 1;
          } while (wVar5 == *piVar9);
          if (pwVar7 < pwVar3) {
            return L'\xffffffec';
          }
          if (iVar4 != 2) {
            if (iVar4 != 1) {
              return L'\xffffffec';
            }
            if ((local_98 < pwVar8) && (wVar5 = ismode_w(local_98,pwVar8,&local_a4), wVar5 != L'\0')
               ) {
              wVar5 = L'✕';
              goto LAB_00239550;
            }
            if (local_a0 != 3) {
              return L'\xffffffec';
            }
            local_a0 = 3;
          }
          if ((local_98 != pwVar8) || (local_88[5] <= local_88[4])) {
            return L'\xffffffec';
          }
          wVar5 = ismode_w(local_88[4],local_88[5],&local_a4);
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          wVar5 = L'✕';
          pwVar8 = (wchar_t *)0x0;
          pwVar7 = (wchar_t *)0x0;
        }
      }
      archive_acl_add_entry_w_len
                (local_38,wVar6,local_a4,wVar5,wVar11,pwVar7,(long)pwVar8 - (long)pwVar7 >> 2);
      uVar1 = 0;
    } while (*text != L'\0');
  }
  return L'\0';
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}